

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O3

void __thiscall SlotManager::~SlotManager(SlotManager *this)

{
  _Rb_tree_node_base *p_Var1;
  SlotMap *__x;
  _Self __tmp;
  SlotMap toDelete;
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_Slot_*const>,_std::_Select1st<std::pair<const_unsigned_long,_Slot_*const>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  _Stack_48;
  
  this->_vptr_SlotManager = (_func_int **)&PTR__SlotManager_0019dd28;
  __x = &this->slots;
  std::
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_Slot_*const>,_std::_Select1st<std::pair<const_unsigned_long,_Slot_*const>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::_Rb_tree(&_Stack_48,&__x->_M_t);
  std::
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_Slot_*const>,_std::_Select1st<std::pair<const_unsigned_long,_Slot_*const>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::clear(&__x->_M_t);
  for (p_Var1 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &_Stack_48._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_Slot_*const>,_std::_Select1st<std::pair<const_unsigned_long,_Slot_*const>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::~_Rb_tree(&_Stack_48);
  std::
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_Slot_*const>,_std::_Select1st<std::pair<const_unsigned_long,_Slot_*const>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::~_Rb_tree(&__x->_M_t);
  return;
}

Assistant:

SlotManager::~SlotManager()
{
	SlotMap toDelete = slots;
	slots.clear();

	for (SlotMap::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		delete i->second;
	}
}